

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode DataValue_decodeBinary(UA_DataValue *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_28;
  byte local_21;
  UA_StatusCode retval;
  UA_Byte encodingMask;
  UA_DataType *__local;
  UA_DataValue *dst_local;
  
  _retval = _;
  __local = (UA_DataType *)dst;
  local_28 = Byte_decodeBinary(&local_21,(UA_DataType *)0x0);
  dst_local._4_4_ = local_28;
  if (local_28 == 0) {
    if ((local_21 & 1) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xfe | 1;
      local_28 = Variant_decodeBinary((UA_Variant *)&__local->typeId,(UA_DataType *)0x0);
    }
    if ((local_21 & 2) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xfd | 2;
      UVar1 = StatusCode_decodeBinary((UA_StatusCode *)&__local[1].typeId);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 4) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xfb | 4;
      UVar1 = DateTime_decodeBinary((UA_DateTime *)&__local[1].typeId.identifier.numeric);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 0x10) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xef | 0x10;
      UVar1 = UInt16_decodeBinary((UA_UInt16 *)__local[1].typeId.identifier.guid.data4,
                                  (UA_DataType *)0x0);
      local_28 = UVar1 | local_28;
      if (9999 < *(ushort *)((long)&__local[1].typeId.identifier + 8)) {
        *(undefined2 *)((long)&__local[1].typeId.identifier + 8) = 9999;
      }
    }
    if ((local_21 & 8) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xf7 | 8;
      UVar1 = DateTime_decodeBinary((UA_DateTime *)&__local[1].memSize);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 0x20) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xdf | 0x20;
      UVar1 = UInt16_decodeBinary((UA_UInt16 *)&__local[1].members,(UA_DataType *)0x0);
      local_28 = UVar1 | local_28;
      if (9999 < *(ushort *)&__local[1].members) {
        *(undefined2 *)&__local[1].members = 9999;
      }
    }
    dst_local._4_4_ = local_28;
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
DataValue_decodeBinary(UA_DataValue *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encodingMask;
    UA_StatusCode retval = Byte_decodeBinary(&encodingMask, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Decode the content */
    if(encodingMask & 0x01) {
        dst->hasValue = true;
        retval |= Variant_decodeBinary(&dst->value, NULL);
    }
    if(encodingMask & 0x02) {
        dst->hasStatus = true;
        retval |= StatusCode_decodeBinary(&dst->status);
    }
    if(encodingMask & 0x04) {
        dst->hasSourceTimestamp = true;
        retval |= DateTime_decodeBinary(&dst->sourceTimestamp);
    }
    if(encodingMask & 0x10) {
        dst->hasSourcePicoseconds = true;
        retval |= UInt16_decodeBinary(&dst->sourcePicoseconds, NULL);
        if(dst->sourcePicoseconds > MAX_PICO_SECONDS)
            dst->sourcePicoseconds = MAX_PICO_SECONDS;
    }
    if(encodingMask & 0x08) {
        dst->hasServerTimestamp = true;
        retval |= DateTime_decodeBinary(&dst->serverTimestamp);
    }
    if(encodingMask & 0x20) {
        dst->hasServerPicoseconds = true;
        retval |= UInt16_decodeBinary(&dst->serverPicoseconds, NULL);
        if(dst->serverPicoseconds > MAX_PICO_SECONDS)
            dst->serverPicoseconds = MAX_PICO_SECONDS;
    }
    return retval;
}